

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjPatchFanoutFanin(Abc_Obj_t *pObj,int iObjNew)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  int local_28;
  int Entry;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  int iObjNew_local;
  Abc_Obj_t *pObj_local;
  
  Entry = 0;
  do {
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 <= Entry) {
      return;
    }
    pAVar4 = Abc_ObjFanout(pObj,Entry);
    for (local_28 = 0; iVar1 = Vec_IntSize(&pAVar4->vFanins), local_28 < iVar1;
        local_28 = local_28 + 1) {
      uVar2 = Vec_IntEntry(&pAVar4->vFanins,local_28);
      uVar3 = Abc_ObjId(pObj);
      if (uVar2 == uVar3) {
        Vec_IntWriteEntry(&pAVar4->vFanins,local_28,iObjNew);
        break;
      }
    }
    iVar1 = Vec_IntSize(&pAVar4->vFanins);
    if (iVar1 <= local_28) {
      __assert_fail("k < Vec_IntSize(&pFanout->vFanins)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                    ,0xec,"void Abc_ObjPatchFanoutFanin(Abc_Obj_t *, int)");
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

void Abc_ObjPatchFanoutFanin( Abc_Obj_t * pObj, int iObjNew )
{
    Abc_Obj_t * pFanout;
    int i, k, Entry;
    // update fanouts of the node to point to this one
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Vec_IntForEachEntry( &pFanout->vFanins, Entry, k )
            if ( Entry == (int)Abc_ObjId(pObj) )
            {
                Vec_IntWriteEntry( &pFanout->vFanins, k, iObjNew );
                break;
            }
        assert( k < Vec_IntSize(&pFanout->vFanins) );
    }
}